

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slurp.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
mcberepair::slurp_string<char,std::char_traits<char>,std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,mcberepair *this,basic_istream<char,_std::char_traits<char>_> *in)

{
  mcberepair mVar1;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\0');
  std::istream::read((char *)this,(long)(__return_storage_ptr__->_M_dataplus)._M_p);
  lVar2 = *(long *)(this + 8);
  mVar1 = this[*(long *)(*(long *)this + -0x18) + 0x20];
  while (((byte)mVar1 & 2) == 0) {
    std::__cxx11::string::resize
              ((ulong)__return_storage_ptr__,(char)__return_storage_ptr__->_M_string_length);
    std::istream::read((char *)this,(long)((__return_storage_ptr__->_M_dataplus)._M_p + lVar2));
    lVar2 = lVar2 + *(long *)(this + 8);
    mVar1 = this[*(long *)(*(long *)this + -0x18) + 0x20];
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT, Traits, Allocator> slurp_string(
    std::basic_istream<CharT, Traits> &in) {
    // create buffer
    std::basic_string<CharT, Traits, Allocator> buffer(
        8192, static_cast<CharT>('\0'));
    std::size_t sz = 0;

    // read into buffer
    in.read(buffer.data() + sz, 8192);
    // count how many values we read
    std::size_t g = in.gcount();
    sz += g;
    while(!in.eof()) {
        // allocate more space
        buffer.resize(buffer.size() + 8192);
        // Keep reading
        in.read(buffer.data() + sz, 8192);
        // count how many values we read
        g = in.gcount();
        sz += g;
    }
    // shrink buffer
    buffer.resize(sz);
    return buffer;
}